

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O2

void MpiDestroyReader(CP_Services Svcs,DP_RS_Stream RS_Stream_v)

{
  void *__ptr;
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  (*Svcs->verbose)(*RS_Stream_v,5,"MpiDestroyReader invoked [rank:%d]\n",
                   (ulong)*(uint *)((long)RS_Stream_v + 8));
  uVar2 = (ulong)*(uint *)((long)RS_Stream_v + 0x18);
  if ((int)*(uint *)((long)RS_Stream_v + 0x18) < 1) {
    uVar2 = uVar1;
  }
  for (; __ptr = *(void **)((long)RS_Stream_v + 0x88), uVar2 * 8 != uVar1; uVar1 = uVar1 + 8) {
    if (*(undefined **)((long)__ptr + uVar1) != &ompi_mpi_comm_null) {
      MPI_Comm_disconnect((long)__ptr + uVar1);
    }
  }
  free(__ptr);
  free(*(void **)((long)RS_Stream_v + 0x80));
  free(RS_Stream_v);
  return;
}

Assistant:

static void MpiDestroyReader(CP_Services Svcs, DP_RS_Stream RS_Stream_v)
{
    MpiStreamRD StreamRS = (MpiStreamRD)RS_Stream_v;

    Svcs->verbose(StreamRS->Stream.CP_Stream, DPTraceVerbose,
                  "MpiDestroyReader invoked [rank:%d]\n", StreamRS->Stream.Rank);

    const int CohortSize = StreamRS->Link.CohortSize;

    for (int i = 0; i < CohortSize; i++)
    {
        if (StreamRS->CohortMpiComms[i] != MPI_COMM_NULL)
        {
            MPI_Comm_disconnect(&StreamRS->CohortMpiComms[i]);
        }
    }
    free(StreamRS->CohortMpiComms);
    free(StreamRS->CohortWriterInfo);
    free(StreamRS);
}